

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O0

void __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::remove<Inferences::ALASCA::FourierMotzkinConf::Lhs>
          (SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
           *this,Lhs *key)

{
  long lVar1;
  Comparison CVar2;
  Node *in_RSI;
  long *in_RDI;
  Node *next;
  uint h;
  Node *left;
  uint foundHeight;
  Node *found;
  uint in_stack_ffffffffffffffb8;
  Comparison in_stack_ffffffffffffffbc;
  uint local_2c;
  long local_28;
  long local_18;
  
  local_2c = (int)in_RDI[1] - 1;
  lVar1 = *in_RDI;
  while( true ) {
    while( true ) {
      while (local_28 = lVar1, lVar1 = *(long *)(local_28 + 0x30 + (ulong)local_2c * 8), lVar1 == 0)
      {
        local_2c = local_2c - 1;
        lVar1 = local_28;
      }
      in_stack_ffffffffffffffbc =
           Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator::
           compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                     (&in_RSI->value,
                      (Lhs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (in_stack_ffffffffffffffbc != LESS) break;
      local_2c = local_2c - 1;
      lVar1 = local_28;
    }
    if (in_stack_ffffffffffffffbc == EQUAL) break;
    if (in_stack_ffffffffffffffbc != GREATER) {
      lVar1 = local_28;
    }
  }
  local_18 = lVar1;
  if ((((local_2c != 0) && (*(long *)(lVar1 + 0x30) != 0)) &&
      (*(long *)(lVar1 + 0x30 + (ulong)local_2c * 8) != *(long *)(lVar1 + 0x30))) &&
     (CVar2 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator
              ::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>
                        (&in_RSI->value,(Lhs *)(ulong)in_stack_ffffffffffffffb8), CVar2 == EQUAL)) {
    local_2c = 0;
    while (*(long *)(lVar1 + 0x30) == *(long *)(lVar1 + 0x30 + (ulong)(local_2c + 1) * 8)) {
      local_2c = local_2c + 1;
    }
    local_18 = *(long *)(lVar1 + 0x30);
    local_28 = lVar1;
  }
  while (*(undefined8 *)(local_28 + 0x30 + (ulong)local_2c * 8) =
              *(undefined8 *)(local_18 + 0x30 + (ulong)local_2c * 8), local_2c != 0) {
    local_2c = local_2c - 1;
    for (; *(long *)(local_28 + 0x30 + (ulong)local_2c * 8) != local_18;
        local_28 = *(long *)(local_28 + 0x30 + (ulong)local_2c * 8)) {
    }
  }
  deallocate(in_RSI,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void remove(Key key)
  {
    ASS(_top > 0);

    Node* found = 0; // found node
#if VDEBUG
    unsigned foundHeight = 0; // its height
#else
    unsigned foundHeight; // its height
#endif

    Node* left = _left;
    unsigned h = _top-1;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	ASS(h != 0); //this would mean that the value is not present in the list
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  ASS(h != 0);
	  h--;
	  break;

	case GREATER:
	  left = next;
	  break;

	case EQUAL:
	  found = next;
	  foundHeight = h;
	  if(h>0 && found->nodes[0] && found->nodes[h]!=found->nodes[0] &&
		  ValueComparator::compare(key,found->nodes[0]->value)==EQUAL) {
	    //The next element exists, contains the same value,
	    //and its height is lower that the height of this one.
	    //We'll rather delete that one, than the one we've found,
	    //because otherwise there'd be only low elements after a few
	    //deletions, which would degrade the skip list to linked list.
	    h=0;
	    while(found->nodes[0]==found->nodes[h+1]) {
	      h++;
	    }
	    left = found;
	    found = found->nodes[0];
	    foundHeight = h;
	  }
	  for(;;) {
	    left->nodes[h] = found->nodes[h];
	    if(h==0) {
	      break;
	    }
	    h--;
	    while(left->nodes[h]!=found) {
	      left=left->nodes[h];
	      ASS(ValueComparator::compare(key,left->value)!=LESS);
	    }
	  }

	  deallocate(found,foundHeight);
	  return;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }